

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

void __thiscall ON_SHA1::set_final_hash(ON_SHA1 *this)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ON__UINT8 byte_00;
  ON__UINT8 byte_80;
  ON__UINT8 pbFinalCount [8];
  ON__UINT8 local_22 [6];
  undefined1 local_1c [4];
  
  uVar1 = this->m_bit_count[1];
  bVar3 = 0x18;
  lVar4 = 0;
  do {
    bVar2 = bVar3 & 0x1f;
    local_22[lVar4 + 2] = (ON__UINT8)(uVar1 >> bVar2);
    lVar4 = lVar4 + 1;
    bVar3 = bVar3 - 8;
  } while (lVar4 != 4);
  uVar1 = this->m_bit_count[0];
  puVar5 = local_1c;
  uVar6 = (ulong)(0 >> bVar2);
  do {
    *puVar5 = (char)(uVar1 >> (((byte)uVar6 ^ 0x18) & 0x1f));
    uVar6 = uVar6 + 8;
    puVar5 = puVar5 + 1;
  } while (uVar6 != 0x20);
  local_22[1] = 0x80;
  Internal_Accumulate(this,local_22 + 1,1);
  local_22[0] = '\0';
  if ((this->m_bit_count[0] & 0x1f8) != 0x1c0) {
    do {
      Internal_Accumulate(this,local_22,1);
    } while ((this->m_bit_count[0] & 0x1f8) != 0x1c0);
  }
  Internal_Accumulate(this,local_22 + 2,8);
  bVar3 = 0;
  lVar4 = 0;
  do {
    (this->m_sha1_hash).m_digest[lVar4] =
         (ON__UINT8)
         (*(uint *)((long)this->m_state + (ulong)((uint)lVar4 & 0xfffffffc)) >> (~bVar3 & 0x18));
    lVar4 = lVar4 + 1;
    bVar3 = bVar3 + 8;
  } while (lVar4 != 0x14);
  return;
}

Assistant:

void ON_SHA1::set_final_hash()
{
  ON__UINT32 i;
  ON__UINT32 bit_count;
  ON__UINT8 pbFinalCount[8];
  bit_count = m_bit_count[1];
  for (i = 0; i < 4; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent
  bit_count = m_bit_count[0];
  for (i = 4; i < 8; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent

  //update((ON__UINT8*)"\200", 1);
  const ON__UINT8 byte_80 = 0x80U;
  Internal_Accumulate(&byte_80, 1);

  const ON__UINT8 byte_00 = 0U;
  while ((m_bit_count[0] & 504) != 448)
    Internal_Accumulate(&byte_00, 1);
    //Internal_Accumulate((ON__UINT8*)"\0", 1);

  Internal_Accumulate(pbFinalCount, 8); // Cause a transform()

  for (i = 0; i < 20; ++i)
    m_sha1_hash.m_digest[i] = static_cast<ON__UINT8>((m_state[i >> 2] >> ((3 - (i & 3)) * 8)) & 0xFF);
}